

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O2

TestStatus *
vkt::wsi::anon_unknown_0::destroyNullHandleSurfaceTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  VkAllocationCallbacks *allocator;
  allocator<char> local_249;
  string local_248;
  AllocationCallbackRecorder recordingAllocator;
  InstanceHelper instHelper;
  
  InstanceHelper::InstanceHelper(&instHelper,context,wsiType,(VkAllocationCallbacks *)0x0);
  ::vk::InstanceDriver::destroySurfaceKHR
            (&instHelper.vki,instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
             (VkSurfaceKHR)0x0,(VkAllocationCallbacks *)0x0);
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&recordingAllocator,allocator,1);
  ::vk::InstanceDriver::destroySurfaceKHR
            (&instHelper.vki,instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
             (VkSurfaceKHR)0x0,
             &recordingAllocator.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks);
  if (recordingAllocator.m_records.m_numElements == 0) {
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recordingAllocator);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&recordingAllocator,"Destroying a VK_NULL_HANDLE surface has no effect",
               (allocator<char> *)&local_248);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&recordingAllocator);
    std::__cxx11::string::~string((string *)&recordingAllocator);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"Implementation allocated/freed the memory",&local_249);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recordingAllocator);
  }
  InstanceHelper::~InstanceHelper(&instHelper);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus destroyNullHandleSurfaceTest (Context& context, Type wsiType)
{
	const InstanceHelper	instHelper	(context, wsiType);
	const VkSurfaceKHR		nullHandle	= DE_NULL;

	// Default allocator
	instHelper.vki.destroySurfaceKHR(*instHelper.instance, nullHandle, DE_NULL);

	// Custom allocator
	{
		AllocationCallbackRecorder	recordingAllocator	(getSystemAllocator(), 1u);

		instHelper.vki.destroySurfaceKHR(*instHelper.instance, nullHandle, recordingAllocator.getCallbacks());

		if (recordingAllocator.getNumRecords() != 0u)
			return tcu::TestStatus::fail("Implementation allocated/freed the memory");
	}

	return tcu::TestStatus::pass("Destroying a VK_NULL_HANDLE surface has no effect");
}